

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O2

void just_test_test_case_f_test_split_lines_keeping_new_line(void)

{
  size_t in_RCX;
  void *__buf;
  char *s_;
  char *s__00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__01;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__03;
  basic_file_view<true> *c__04;
  void *__buf_00;
  char *s__02;
  char *s__03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__04;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *c__05;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__06;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__07;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__08;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__09;
  basic_file_view<true> *c__10;
  char (*s__05) [8];
  char (*s__06) [9];
  char (*s__07) [9];
  char (*s__08) [8];
  char (*s__09) [9];
  char (*s__10) [9];
  char (*s__11) [9];
  char (*s__12) [11];
  char (*s__13) [11];
  char (*s__14) [9];
  char (*s__15) [10];
  char (*s__16) [10];
  char (*s__17) [10];
  char (*s__18) [10];
  char (*s__19) [2];
  char (*s__20) [2];
  void *__buf_01;
  char *s__21;
  char *s__22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__23;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *c__11;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__12;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__13;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__14;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> *c__15;
  basic_file_view<true> *c__16;
  allocator<char> local_f69;
  allocator<char> local_f68 [32];
  assert_equal_container local_f48;
  allocator<char> local_f19;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> view5_2;
  string path;
  allocator<char> local_eea;
  allocator<char> local_ee9;
  assert_equal_container local_ee8;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> view5;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> view4;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> view3;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_true> view2;
  directory tmp;
  string_list_builder local_e80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  view1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  string local_d28;
  string local_d08 [32];
  string str;
  istringstream s2;
  basic_file_view<true> view6;
  istringstream s1;
  ifstream fs1;
  istringstream s3;
  ifstream fs3;
  ifstream fs2;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_d08,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_ee8,local_d08);
  local_ee8._assert_msg._line = 0xca;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"",&local_f19);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&v12_2,&local_d28);
  just::temp::directory::directory(&tmp);
  std::operator+(&path,&tmp._path,"/test");
  std::__cxx11::string::string<std::allocator<char>>((string *)&fs1,"",(allocator<char> *)&fs2);
  just::file::write((file *)&path,(int)&fs1,__buf,in_RCX);
  std::__cxx11::string::~string((string *)&fs1);
  std::ifstream::ifstream(&fs1,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs2,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs3,path._M_dataplus._M_p,_S_in|_S_bin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"",(allocator<char> *)&s2);
  std::__cxx11::istringstream::istringstream((istringstream *)&s1,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"",(allocator<char> *)&s3);
  std::__cxx11::istringstream::istringstream((istringstream *)&s2,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"",(allocator<char> *)&local_f48);
  std::__cxx11::istringstream::istringstream((istringstream *)&s3,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&str,"",(allocator<char> *)&view6);
  view5._stream = (istream *)&fs2;
  view4._stream = (istream *)&s2;
  view3._stream = (istream *)&fs1;
  view2._stream = (istream *)&s1;
  view1._string = &str;
  just::lines::basic_file_view<true>::basic_file_view(&view6,&path);
  just::lines::split<true,char_const>(&local_e80._list,(lines *)0x11c1de,s_);
  just::lines::split<true,char_const>(&v2,(lines *)0x11c1de,s__00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"",local_f68);
  just::lines::split<true,std::__cxx11::string>(&v3,(lines *)&local_f48,s__01);
  std::__cxx11::string::~string((string *)&local_f48);
  just::lines::split<true>(&v4,(istream *)&s3);
  just::lines::split<true>(&v5,(istream *)&fs3);
  just::lines::split_lines_of_file<true>(&v6,&path);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,true>>
            (&v7,(_anonymous_namespace_ *)&view1,c_);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v8,(_anonymous_namespace_ *)&view2,c__00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v9,(_anonymous_namespace_ *)&view3,c__01);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v10,(_anonymous_namespace_ *)&view4,c__02);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v11,(_anonymous_namespace_ *)&view5,c__03);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<true>>
            (&v12,(_anonymous_namespace_ *)&view6,c__04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e80._list,&v2);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v2,&v3);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v3,&v4);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v4,&v5);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v5,&v6);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v6,&v7);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v7,&v8);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v8,&v9);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v9,&v10);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v10,&v11);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v2);
  std::ifstream::~ifstream(&view6);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s3);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s1);
  std::ifstream::~ifstream(&fs3);
  std::ifstream::~ifstream(&fs2);
  std::ifstream::~ifstream(&fs1);
  std::__cxx11::string::~string((string *)&path);
  just::temp::directory::~directory(&tmp);
  just::test::assert_equal_container::operator()
            (&local_ee8,(string_list_builder *)&v12_2,&local_e80._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e80._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12_2);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string(local_d08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d08,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_ee8,local_d08);
  local_ee8._assert_msg._line = 0xcb;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"foo",&local_f19);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&v12_2,&local_d28);
  just::temp::directory::directory(&tmp);
  std::operator+(&path,&tmp._path,"/test");
  std::__cxx11::string::string<std::allocator<char>>((string *)&fs1,"foo",(allocator<char> *)&fs2);
  just::file::write((file *)&path,(int)&fs1,__buf_00,in_RCX);
  std::__cxx11::string::~string((string *)&fs1);
  std::ifstream::ifstream(&fs1,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs2,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs3,path._M_dataplus._M_p,_S_in|_S_bin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"foo",(allocator<char> *)&s2);
  std::__cxx11::istringstream::istringstream((istringstream *)&s1,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"foo",(allocator<char> *)&s3);
  std::__cxx11::istringstream::istringstream((istringstream *)&s2,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"foo",(allocator<char> *)&local_f48);
  std::__cxx11::istringstream::istringstream((istringstream *)&s3,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&str,"foo",(allocator<char> *)&view6)
  ;
  view5._stream = (istream *)&fs2;
  view4._stream = (istream *)&s2;
  view3._stream = (istream *)&fs1;
  view2._stream = (istream *)&s1;
  view1._string = &str;
  just::lines::basic_file_view<true>::basic_file_view(&view6,&path);
  just::lines::split<true,char_const>(&local_e80._list,(lines *)"foo",s__02);
  just::lines::split<true,char_const>(&v2,(lines *)"foo",s__03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"foo",local_f68);
  just::lines::split<true,std::__cxx11::string>(&v3,(lines *)&local_f48,s__04);
  std::__cxx11::string::~string((string *)&local_f48);
  just::lines::split<true>(&v4,(istream *)&s3);
  just::lines::split<true>(&v5,(istream *)&fs3);
  just::lines::split_lines_of_file<true>(&v6,&path);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,true>>
            (&v7,(_anonymous_namespace_ *)&view1,c__05);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v8,(_anonymous_namespace_ *)&view2,c__06);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v9,(_anonymous_namespace_ *)&view3,c__07);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v10,(_anonymous_namespace_ *)&view4,c__08);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v11,(_anonymous_namespace_ *)&view5,c__09);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<true>>
            (&v12,(_anonymous_namespace_ *)&view6,c__10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e80._list,&v2);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v2,&v3);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v3,&v4);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v4,&v5);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v5,&v6);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v6,&v7);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v7,&v8);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v8,&v9);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v9,&v10);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&view5_2);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v10,&v11);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v2);
  std::ifstream::~ifstream(&view6);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s3);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s1);
  std::ifstream::~ifstream(&fs3);
  std::ifstream::~ifstream(&fs2);
  std::ifstream::~ifstream(&fs1);
  std::__cxx11::string::~string((string *)&path);
  just::temp::directory::~directory(&tmp);
  just::test::assert_equal_container::operator()
            (&local_ee8,(string_list_builder *)&v12_2,&local_e80._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e80._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12_2);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string(local_d08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&s3);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\n",(allocator<char> *)&local_f48);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s1,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar",(allocator<char> *)&local_ee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s1,(value_type *)&view6);
  (anonymous_namespace)::split_lines<true,8>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2,(_anonymous_namespace_ *)"foo\nbar",s__05);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\n\nbar",s__06);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\nbar\n",s__07);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&s3);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r",(allocator<char> *)&local_f48);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s1,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar",(allocator<char> *)&local_ee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s1,(value_type *)&view6);
  (anonymous_namespace)::split_lines<true,8>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2,(_anonymous_namespace_ *)"foo\rbar",s__08);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\r",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\rbar",s__09);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar\r",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\rbar\r",s__10);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&s3);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r\n",(allocator<char> *)&local_f48);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s1,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar",(allocator<char> *)&local_ee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s1,(value_type *)&view6);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2,(_anonymous_namespace_ *)"foo\r\nbar",s__11);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"\r\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,11>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\n\r\nbar",s__12);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"bar\r\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,11>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\nbar\r\n",s__13);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\r",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,9>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\n\rbar",s__14);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"\r\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,10>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\n\r\nbar",s__15);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"\r\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,10>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\r\nbar",s__16);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\r",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,10>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\n\rbar",s__17);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&local_f48);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"foo\r\n",(allocator<char> *)&local_ee8);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s2,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\n",(allocator<char> *)&tmp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s1,"bar",(allocator<char> *)&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s2,(value_type *)&s1);
  (anonymous_namespace)::split_lines<true,10>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3,(_anonymous_namespace_ *)"foo\r\n\nbar",s__18);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s3);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&s3);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"\n",(allocator<char> *)&local_f48);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s1,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"",(allocator<char> *)&local_ee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s1,(value_type *)&view6);
  (anonymous_namespace)::split_lines<true,2>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2,(_anonymous_namespace_ *)0x11c1dd,s__19);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,(allocator<char> *)&s3);
  std::__cxx11::string::string((string *)&fs1,(string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs3,"\r",(allocator<char> *)&local_f48);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder
            ((string_list_builder *)&s1,(string *)&fs3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"",(allocator<char> *)&local_ee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&s1,(value_type *)&view6);
  (anonymous_namespace)::split_lines<true,2>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2,(_anonymous_namespace_ *)0x11c1d7,s__20);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)&fs1,(string_list_builder *)&s1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&s2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s2);
  std::__cxx11::string::~string((string *)&view6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s1);
  std::__cxx11::string::~string((string *)&fs3);
  std::__cxx11::string::~string((string *)&fs1);
  std::__cxx11::string::~string((string *)&fs2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d08,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f19);
  std::__cxx11::string::string((string *)&local_ee8,local_d08);
  local_ee8._assert_msg._line = 0x108;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"\r\n",&local_ee9);
  anon_unknown.dwarf_12274::string_list_builder::string_list_builder(&local_e80,&local_d28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&v2,"",&local_eea);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e80._list,(value_type *)&v2);
  just::temp::directory::directory(&tmp);
  std::operator+(&path,&tmp._path,"/test");
  std::__cxx11::string::string<std::allocator<char>>((string *)&fs1,"\r\n",(allocator<char> *)&fs2);
  just::file::write((file *)&path,(int)&fs1,__buf_01,in_RCX);
  std::__cxx11::string::~string((string *)&fs1);
  std::ifstream::ifstream(&fs1,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs2,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs3,path._M_dataplus._M_p,_S_in|_S_bin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\r\n",(allocator<char> *)&s2)
  ;
  std::__cxx11::istringstream::istringstream((istringstream *)&s1,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&view6,"\r\n",(allocator<char> *)&s3)
  ;
  std::__cxx11::istringstream::istringstream((istringstream *)&s2,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,"\r\n",(allocator<char> *)&local_f48);
  std::__cxx11::istringstream::istringstream((istringstream *)&s3,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"\r\n",(allocator<char> *)&view6);
  view5_2._stream = (istream *)&fs2;
  view5._stream = (istream *)&s2;
  view4._stream = (istream *)&fs1;
  view3._stream = (istream *)&s1;
  view2._stream = (istream *)&str;
  just::lines::basic_file_view<true>::basic_file_view(&view6,&path);
  just::lines::split<true,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&view1,(lines *)0x11c1dc,s__21);
  just::lines::split<true,char_const>(&v3,(lines *)0x11c1dc,s__22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"\r\n",local_f68);
  just::lines::split<true,std::__cxx11::string>(&v4,(lines *)&local_f48,s__23);
  std::__cxx11::string::~string((string *)&local_f48);
  just::lines::split<true>(&v5,(istream *)&s3);
  just::lines::split<true>(&v6,(istream *)&fs3);
  just::lines::split_lines_of_file<true>(&v7,&path);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,true>>
            (&v8,(_anonymous_namespace_ *)&view2,c__11);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v9,(_anonymous_namespace_ *)&view3,c__12);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v10,(_anonymous_namespace_ *)&view4,c__13);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v11,(_anonymous_namespace_ *)&view5,c__14);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,true>>
            (&v12,(_anonymous_namespace_ *)&view5_2,c__15);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<true>>
            (&v12_2,(_anonymous_namespace_ *)&view6,c__16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&view1,&v3);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v3,&v4);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v4,&v5);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v5,&v6);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v6,&v7);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v7,&v8);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v8,&v9);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v9,&v10);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v10,&v11);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f69);
  std::__cxx11::string::string((string *)&local_f48,(string *)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&v11,&v12);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)local_f68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v3);
  std::ifstream::~ifstream(&view6);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s3);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s1);
  std::ifstream::~ifstream(&fs3);
  std::ifstream::~ifstream(&fs2);
  std::ifstream::~ifstream(&fs1);
  std::__cxx11::string::~string((string *)&path);
  just::temp::directory::~directory(&tmp);
  just::test::assert_equal_container::operator()
            (&local_ee8,&local_e80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&view1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&view1);
  std::__cxx11::string::~string((string *)&v2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e80._list);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string(local_d08);
  return;
}

Assistant:

JUST_TEST_CASE(test_split_lines_keeping_new_line)
{
  typedef string_list_builder v;

  JUST_ASSERT_EQUAL_CONTAINER(v(""), split_lines<true>(""));
  JUST_ASSERT_EQUAL_CONTAINER(v("foo"), split_lines<true>("foo"));

  JUST_ASSERT_EQUAL_CONTAINER(v("foo\n")("bar"), split_lines<true>("foo\nbar"));
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\n")("bar"),
    split_lines<true>("foo\n\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("bar\n")(""),
    split_lines<true>("foo\nbar\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar"),
    split_lines<true>("foo\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r")("bar"),
    split_lines<true>("foo\r\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar\r")(""),
    split_lines<true>("foo\rbar\r")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar"),
    split_lines<true>("foo\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r\n")("bar"),
    split_lines<true>("foo\r\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar\r\n")(""),
    split_lines<true>("foo\r\nbar\r\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r")("bar"),
    split_lines<true>("foo\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r\n")("bar"),
    split_lines<true>("foo\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r\n")("bar"),
    split_lines<true>("foo\r\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r")("bar"),
    split_lines<true>("foo\r\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\n")("bar"),
    split_lines<true>("foo\r\n\nbar")
  );

  JUST_ASSERT_EQUAL_CONTAINER(v("\n")(""), split_lines<true>("\n"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r")(""), split_lines<true>("\r"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r\n")(""), split_lines<true>("\r\n"));
}